

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::RegisterTraceWriterResponse::~RegisterTraceWriterResponse
          (RegisterTraceWriterResponse *this)

{
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__RegisterTraceWriterResponse_00409710;
  ::std::__cxx11::string::~string((string *)&this->unknown_fields_);
  return;
}

Assistant:

RegisterTraceWriterResponse::~RegisterTraceWriterResponse() = default;